

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

size_t get_number_of_registered_devices(AMQP_TRANSPORT_INSTANCE *transport)

{
  LIST_ITEM_HANDLE local_20;
  LIST_ITEM_HANDLE list_item;
  size_t result;
  AMQP_TRANSPORT_INSTANCE *transport_local;
  
  list_item = (LIST_ITEM_HANDLE)0x0;
  for (local_20 = singlylinkedlist_get_head_item(transport->registered_devices);
      local_20 != (LIST_ITEM_HANDLE)0x0; local_20 = singlylinkedlist_get_next_item(local_20)) {
    list_item = (LIST_ITEM_HANDLE)((long)&list_item->item + 1);
  }
  return (size_t)list_item;
}

Assistant:

static size_t get_number_of_registered_devices(AMQP_TRANSPORT_INSTANCE* transport)
{
    size_t result = 0;

    LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(transport->registered_devices);

    while (list_item != NULL)
    {
        result++;
        list_item = singlylinkedlist_get_next_item(list_item);
    }

    return result;
}